

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void convert_32s1u_C1R(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  ulong uVar1;
  int local_64;
  int local_60;
  OPJ_UINT32 src6_1;
  OPJ_UINT32 src5_1;
  OPJ_UINT32 src4_1;
  OPJ_UINT32 src3_1;
  OPJ_UINT32 src2_1;
  OPJ_UINT32 src1_1;
  OPJ_UINT32 src0_1;
  OPJ_UINT32 src7;
  OPJ_UINT32 src6;
  OPJ_UINT32 src5;
  OPJ_UINT32 src4;
  OPJ_UINT32 src3;
  OPJ_UINT32 src2;
  OPJ_UINT32 src1;
  OPJ_UINT32 src0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_BYTE *pDst_local;
  OPJ_INT32 *pSrc_local;
  
  length_local = (OPJ_SIZE_T)pDst;
  for (_src1 = 0; _src1 < (length & 0xfffffffffffffff8); _src1 = _src1 + 8) {
    *(byte *)length_local =
         (byte)(pSrc[_src1] << 7) | (byte)(pSrc[_src1 + 1] << 6) | (byte)(pSrc[_src1 + 2] << 5) |
         (byte)(pSrc[_src1 + 3] << 4) | (byte)(pSrc[_src1 + 4] << 3) | (byte)(pSrc[_src1 + 5] << 2)
         | (byte)(pSrc[_src1 + 6] << 1) | (byte)pSrc[_src1 + 7];
    length_local = length_local + 1;
  }
  if ((length & 7) != 0) {
    src3_1 = 0;
    src4_1 = 0;
    src5_1 = 0;
    src6_1 = 0;
    local_60 = 0;
    local_64 = 0;
    uVar1 = length & 7;
    if ((((1 < uVar1) && (src3_1 = pSrc[_src1 + 1], 2 < uVar1)) &&
        (src4_1 = pSrc[_src1 + 2], 3 < uVar1)) &&
       (((src5_1 = pSrc[_src1 + 3], 4 < uVar1 && (src6_1 = pSrc[_src1 + 4], 5 < uVar1)) &&
        (local_60 = pSrc[_src1 + 5], 6 < uVar1)))) {
      local_64 = pSrc[_src1 + 6];
    }
    *(byte *)length_local =
         (byte)(pSrc[_src1] << 7) | (byte)(src3_1 << 6) | (byte)(src4_1 << 5) | (byte)(src5_1 << 4)
         | (byte)(src6_1 << 3) | (byte)(local_60 << 2) | (byte)(local_64 << 1);
  }
  return;
}

Assistant:

static void convert_32s1u_C1R(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                              OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 << 7) | (src1 << 6) | (src2 << 5) | (src3 << 4) |
                             (src4 << 3) | (src5 << 2) | (src6 << 1) | src7);
    }

    if (length & 7U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = 0U;
        OPJ_UINT32 src2 = 0U;
        OPJ_UINT32 src3 = 0U;
        OPJ_UINT32 src4 = 0U;
        OPJ_UINT32 src5 = 0U;
        OPJ_UINT32 src6 = 0U;
        length = length & 7U;

        if (length > 1U) {
            src1 = (OPJ_UINT32)pSrc[i + 1];
            if (length > 2U) {
                src2 = (OPJ_UINT32)pSrc[i + 2];
                if (length > 3U) {
                    src3 = (OPJ_UINT32)pSrc[i + 3];
                    if (length > 4U) {
                        src4 = (OPJ_UINT32)pSrc[i + 4];
                        if (length > 5U) {
                            src5 = (OPJ_UINT32)pSrc[i + 5];
                            if (length > 6U) {
                                src6 = (OPJ_UINT32)pSrc[i + 6];
                            }
                        }
                    }
                }
            }
        }
        *pDst++ = (OPJ_BYTE)((src0 << 7) | (src1 << 6) | (src2 << 5) | (src3 << 4) |
                             (src4 << 3) | (src5 << 2) | (src6 << 1));
    }
}